

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

char kj::anon_unknown_39::parseInteger<signed_char>(StringPtr *s)

{
  char cVar1;
  char cVar2;
  longlong lVar3;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  cVar1 = MinValue_::operator_cast_to_signed_char((MinValue_ *)&minValue);
  cVar2 = MaxValue_::operator_cast_to_signed_char((MaxValue_ *)&maxValue);
  lVar3 = parseSigned(s,(long)cVar1,(long)cVar2);
  return (char)lVar3;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}